

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdockwidget.cpp
# Opt level: O2

void __thiscall QDockWidget::paintEvent(QDockWidget *this,QPaintEvent *event)

{
  long lVar1;
  long lVar2;
  QLayoutItem *pQVar3;
  QWidgetData *pQVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  bool bVar7;
  char cVar8;
  int iVar9;
  QLayout *object;
  QDockWidgetLayout *this_00;
  undefined4 extraout_var;
  long in_FS_OFFSET;
  bool bVar10;
  undefined1 *local_b8;
  QWidget *pQStack_b0;
  QStyle *local_a8;
  QFont local_98 [16];
  QStyleOptionDockWidget titleOpt;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  lVar2 = *(long *)&(this->super_QWidget).field_0x8;
  object = QWidget::layout(&this->super_QWidget);
  this_00 = QtPrivate::qobject_cast_helper<QDockWidgetLayout*,QObject>(&object->super_QObject);
  pQVar3 = (this_00->item_list).d.ptr[3];
  if (pQVar3 == (QLayoutItem *)0x0) {
    bVar10 = true;
  }
  else {
    iVar9 = (*pQVar3->_vptr_QLayoutItem[0xd])();
    bVar10 = CONCAT44(extraout_var,iVar9) == 0;
  }
  bVar7 = QDockWidgetLayout::nativeWindowDeco(this_00);
  if ((bVar10) && (!bVar7)) {
    local_a8 = (QStyle *)&DAT_aaaaaaaaaaaaaaaa;
    local_b8 = &DAT_aaaaaaaaaaaaaaaa;
    pQStack_b0 = (QWidget *)&DAT_aaaaaaaaaaaaaaaa;
    QStylePainter::QStylePainter((QStylePainter *)&local_b8,&this->super_QWidget);
    if (((((this->super_QWidget).data)->window_flags).super_QFlagsStorageHelper<Qt::WindowType,_4>.
         super_QFlagsStorage<Qt::WindowType>.i & 1) != 0) {
      titleOpt.title.d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
      titleOpt.title.d.ptr = (char16_t *)&DAT_aaaaaaaaaaaaaaaa;
      titleOpt.super_QStyleOption.palette._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
      titleOpt.super_QStyleOption.styleObject = (QObject *)&DAT_aaaaaaaaaaaaaaaa;
      titleOpt.super_QStyleOption._32_8_ = &DAT_aaaaaaaaaaaaaaaa;
      titleOpt.super_QStyleOption.palette.d = (QPalettePrivate *)&DAT_aaaaaaaaaaaaaaaa;
      titleOpt.super_QStyleOption.rect._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
      titleOpt.super_QStyleOption.rect._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
      titleOpt.super_QStyleOption._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
      titleOpt.super_QStyleOption._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
      QStyleOptionFrame::QStyleOptionFrame((QStyleOptionFrame *)&titleOpt);
      QStyleOption::initFrom(&titleOpt.super_QStyleOption,&this->super_QWidget);
      QStylePainter::drawPrimitive
                ((QStylePainter *)&local_b8,PE_FrameDockWidget,&titleOpt.super_QStyleOption);
      QStyleOption::~QStyleOption(&titleOpt.super_QStyleOption);
    }
    titleOpt.title.d.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
    titleOpt._88_8_ = &DAT_aaaaaaaaaaaaaaaa;
    titleOpt.title.d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
    titleOpt.title.d.ptr = (char16_t *)&DAT_aaaaaaaaaaaaaaaa;
    titleOpt.super_QStyleOption.palette._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
    titleOpt.super_QStyleOption.styleObject = (QObject *)&DAT_aaaaaaaaaaaaaaaa;
    titleOpt.super_QStyleOption._32_8_ = &DAT_aaaaaaaaaaaaaaaa;
    titleOpt.super_QStyleOption.palette.d = (QPalettePrivate *)&DAT_aaaaaaaaaaaaaaaa;
    titleOpt.super_QStyleOption.rect._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
    titleOpt.super_QStyleOption.rect._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
    titleOpt.super_QStyleOption._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
    titleOpt.super_QStyleOption._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
    QStyleOptionDockWidget::QStyleOptionDockWidget(&titleOpt);
    (**(code **)(*(long *)&this->super_QWidget + 0x1a0))(this,&titleOpt);
    pQVar4 = (this->super_QWidget).data;
    QApplication::font((QApplication *)local_98,"QDockWidget");
    cVar8 = QFont::operator==(&pQVar4->fnt,local_98);
    QFont::~QFont(local_98);
    if (cVar8 != '\0') {
      QFontMetrics::QFontMetrics((QFontMetrics *)local_98,(QFont *)(lVar2 + 0x268));
      uVar5 = titleOpt.super_QStyleOption._32_8_;
      titleOpt.super_QStyleOption.fontMetrics = (QFontMetrics)local_98[0];
      titleOpt.super_QStyleOption._33_1_ = local_98[1];
      titleOpt.super_QStyleOption._34_1_ = local_98[2];
      titleOpt.super_QStyleOption._35_1_ = local_98[3];
      titleOpt.super_QStyleOption._36_1_ = local_98[4];
      titleOpt.super_QStyleOption._37_1_ = local_98[5];
      titleOpt.super_QStyleOption._38_1_ = local_98[6];
      titleOpt.super_QStyleOption._39_1_ = local_98[7];
      uVar6 = titleOpt.super_QStyleOption._32_8_;
      titleOpt.super_QStyleOption.fontMetrics = SUB81(uVar5,0);
      titleOpt.super_QStyleOption._33_1_ = SUB81(uVar5,1);
      titleOpt.super_QStyleOption._34_1_ = SUB81(uVar5,2);
      titleOpt.super_QStyleOption._35_1_ = SUB81(uVar5,3);
      titleOpt.super_QStyleOption._36_1_ = SUB81(uVar5,4);
      titleOpt.super_QStyleOption._37_1_ = SUB81(uVar5,5);
      titleOpt.super_QStyleOption._38_1_ = SUB81(uVar5,6);
      titleOpt.super_QStyleOption._39_1_ = SUB81(uVar5,7);
      local_98[0] = (QFont)titleOpt.super_QStyleOption.fontMetrics;
      local_98[1] = (QFont)titleOpt.super_QStyleOption._33_1_;
      local_98[2] = (QFont)titleOpt.super_QStyleOption._34_1_;
      local_98[3] = (QFont)titleOpt.super_QStyleOption._35_1_;
      local_98[4] = (QFont)titleOpt.super_QStyleOption._36_1_;
      local_98[5] = (QFont)titleOpt.super_QStyleOption._37_1_;
      local_98[6] = (QFont)titleOpt.super_QStyleOption._38_1_;
      local_98[7] = (QFont)titleOpt.super_QStyleOption._39_1_;
      titleOpt.super_QStyleOption._32_8_ = uVar6;
      QFontMetrics::~QFontMetrics((QFontMetrics *)local_98);
      QPainter::setFont((QFont *)&local_b8);
    }
    QStylePainter::drawControl
              ((QStylePainter *)&local_b8,CE_DockWidgetTitle,&titleOpt.super_QStyleOption);
    QStyleOptionDockWidget::~QStyleOptionDockWidget(&titleOpt);
    QPainter::~QPainter((QPainter *)&local_b8);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QDockWidget::paintEvent(QPaintEvent *event)
{
    Q_UNUSED(event);
    Q_D(QDockWidget);

    QDockWidgetLayout *layout
        = qobject_cast<QDockWidgetLayout*>(this->layout());
    bool customTitleBar = layout->widgetForRole(QDockWidgetLayout::TitleBar) != nullptr;
    bool nativeDeco = layout->nativeWindowDeco();

    if (!nativeDeco && !customTitleBar) {
        QStylePainter p(this);
        // ### Add PixelMetric to change spacers, so style may show border
        // when not floating.
        if (isFloating()) {
            QStyleOptionFrame framOpt;
            framOpt.initFrom(this);
            p.drawPrimitive(QStyle::PE_FrameDockWidget, framOpt);
        }

        // Title must be painted after the frame, since the areas overlap, and
        // the title may wish to extend out to all sides (eg. Vista style)
        QStyleOptionDockWidget titleOpt;
        initStyleOption(&titleOpt);
        if (font() == QApplication::font("QDockWidget")) {
            titleOpt.fontMetrics = QFontMetrics(d->font);
            p.setFont(d->font);
        }

        p.drawControl(QStyle::CE_DockWidgetTitle, titleOpt);
    }
}